

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool CaDiCaL::parse_int_str(char *val_str,int *val)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  undefined4 *in_RSI;
  int iVar4;
  char *in_RDI;
  int i;
  int64_t val64;
  int exponent;
  int digit;
  int64_t mantissa;
  int64_t bound;
  int ch;
  int sign;
  char *p;
  int local_50;
  int local_4c;
  long local_48;
  int local_40;
  long local_38;
  int local_24;
  char *local_20;
  
  iVar2 = strcmp(in_RDI,"true");
  if (iVar2 == 0) {
    *in_RSI = 1;
  }
  else {
    iVar2 = strcmp(in_RDI,"false");
    if (iVar2 == 0) {
      *in_RSI = 0;
    }
    else {
      if (*in_RDI == '-') {
        local_24 = -1;
        local_20 = in_RDI + 1;
      }
      else {
        local_24 = 1;
        local_20 = in_RDI;
      }
      cVar1 = *local_20;
      iVar2 = isdigit((int)cVar1);
      if (iVar2 == 0) {
        return false;
      }
      local_38 = (long)(cVar1 + -0x30);
      local_20 = local_20 + 1;
      while( true ) {
        pcVar3 = local_20 + 1;
        iVar4 = (int)*local_20;
        iVar2 = isdigit(iVar4);
        local_20 = pcVar3;
        if (iVar2 == 0) break;
        if (local_38 < 0xccccccd) {
          local_38 = local_38 * 10;
        }
        else {
          local_38 = 0x80000000;
        }
        if (0x80000000 - (long)(iVar4 + -0x30) < local_38) {
          local_38 = 0x80000000;
        }
        else {
          local_38 = (iVar4 + -0x30) + local_38;
        }
      }
      local_40 = 0;
      if (iVar4 == 0x65) {
        while( true ) {
          local_50 = (int)*local_20;
          iVar2 = isdigit(local_50);
          if (iVar2 == 0) break;
          if (local_40 == 0) {
            local_50 = local_50 + -0x30;
          }
          else {
            local_50 = 10;
          }
          local_40 = local_50;
          local_20 = local_20 + 1;
        }
        if (local_50 != 0) {
          return false;
        }
      }
      else if (iVar4 != 0) {
        return false;
      }
      local_48 = local_38;
      for (local_4c = 0; local_4c < local_40; local_4c = local_4c + 1) {
        local_48 = local_48 * 10;
      }
      if (local_24 < 0) {
        local_48 = -local_48;
        if (local_48 < -0x80000000) {
          local_48 = -0x80000000;
        }
      }
      else {
        if (0x7fffffff < local_48) {
          local_48 = 0x7fffffff;
        }
      }
      *in_RSI = (undefined4)local_48;
    }
  }
  return true;
}

Assistant:

bool parse_int_str (const char *val_str, int &val) {
  if (!strcmp (val_str, "true"))
    val = 1;
  else if (!strcmp (val_str, "false"))
    val = 0;
  else {
    const char *p = val_str;
    int sign;

    if (*p == '-')
      sign = -1, p++;
    else
      sign = 1;

    int ch;
    if (!isdigit ((ch = *p++)))
      return false;

    const int64_t bound = -(int64_t) INT_MIN;
    int64_t mantissa = ch - '0';

    while (isdigit (ch = *p++)) {
      if (bound / 10 < mantissa)
        mantissa = bound;
      else
        mantissa *= 10;
      const int digit = ch - '0';
      if (bound - digit < mantissa)
        mantissa = bound;
      else
        mantissa += digit;
    }

    int exponent = 0;
    if (ch == 'e') {
      while (isdigit ((ch = *p++)))
        exponent = exponent ? 10 : ch - '0';
      if (ch)
        return false;
    } else if (ch)
      return false;

    assert (exponent <= 10);
    int64_t val64 = mantissa;
    for (int i = 0; i < exponent; i++)
      val64 *= 10;

    if (sign < 0) {
      val64 = -val64;
      if (val64 < INT_MIN)
        val64 = INT_MIN;
    } else {
      if (val64 > INT_MAX)
        val64 = INT_MAX;
    }

    assert (INT_MIN <= val64);
    assert (val64 <= INT_MAX);

    val = val64;
  }
  return true;
}